

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdInitializeMultisigScript(void *handle,int network_type,int hash_type,void **multisig_handle)

{
  long lVar1;
  AddressType AVar2;
  undefined8 uVar3;
  void *pvVar4;
  long *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CfdException *except;
  exception *std_except;
  CfdCapiMultisigScript *data;
  AddressType addr_type;
  string *in_stack_fffffffffffffee0;
  allocator *paVar5;
  undefined8 in_stack_fffffffffffffee8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffef0;
  CfdException *this;
  bool *in_stack_ffffffffffffff28;
  string local_d0 [4];
  int in_stack_ffffffffffffff34;
  undefined1 local_a9 [53];
  uint32_t size;
  undefined2 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff96;
  allocator in_stack_ffffffffffffff97;
  string local_68 [32];
  CfdSourceLocation local_48;
  long *local_20;
  undefined4 local_18;
  undefined4 local_14;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  size = (uint32_t)((ulong)stack0xffffffffffffff88 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  cfd::Initialize();
  if (local_20 == (long *)0x0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0xdc;
    local_48.funcname = "CfdInitializeMultisigScript";
    cfd::core::logger::warn<>(&local_48,"multisig handle is null.");
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_68,"Failed to parameter. multisig handle is null.",
               (allocator *)&stack0xffffffffffffff97);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffef0,error_code,in_stack_fffffffffffffee0);
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::capi::ConvertNetType(in_stack_ffffffffffffff34,in_stack_ffffffffffffff28);
  AVar2 = cfd::capi::ConvertHashToAddressType(in_stack_ffffffffffffff34);
  if (((AVar2 != kP2shAddress) && (AVar2 != kP2wshAddress)) && (AVar2 != kP2shP2wshAddress)) {
    local_a9._33_8_ =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_a9._33_8_ = local_a9._33_8_ + 1;
    local_a9._41_4_ = 0xe9;
    cfd::core::logger::warn<>((CfdSourceLocation *)(local_a9 + 0x21),"pkh is not target.");
    uVar3 = __cxa_allocate_exception(0x30);
    this = (CfdException *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_a9 + 1),"Failed to parameter. hash type cannot used pkh target.",
               (allocator *)this);
    cfd::core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar3 >> 0x20),in_stack_fffffffffffffee0);
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar5 = (allocator *)&stack0xffffffffffffff2f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"MultisigScript",paVar5);
  pvVar4 = cfd::capi::AllocBuffer
                     ((string *)
                      CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,
                                        CONCAT24(in_stack_ffffffffffffff94,AVar2))),size);
  *local_20 = (long)pvVar4;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  lVar1 = *local_20;
  *(undefined4 *)(lVar1 + 0x10) = local_14;
  *(undefined4 *)(lVar1 + 0x14) = local_18;
  return 0;
}

Assistant:

int CfdInitializeMultisigScript(
    void* handle, int network_type, int hash_type, void** multisig_handle) {
  try {
    cfd::Initialize();
    if (multisig_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "multisig handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. multisig handle is null.");
    }
    cfd::capi::ConvertNetType(network_type, nullptr);
    AddressType addr_type = ConvertHashToAddressType(hash_type);
    switch (addr_type) {
      case AddressType::kP2shAddress:
      case AddressType::kP2wshAddress:
      case AddressType::kP2shP2wshAddress:
        break;
      default:
        warn(CFD_LOG_SOURCE, "pkh is not target.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hash type cannot used pkh target.");
    }

    *multisig_handle =
        AllocBuffer(kPrefixMultisigScript, sizeof(CfdCapiMultisigScript));
    CfdCapiMultisigScript* data =
        static_cast<CfdCapiMultisigScript*>(*multisig_handle);
    data->network_type = network_type;
    data->hash_type = hash_type;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}